

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-object.c
# Opt level: O0

void pdf_array_push_drop(hd_context *ctx,pdf_obj *obj,pdf_obj *item)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  pdf_obj *item_local;
  pdf_obj *obj_local;
  hd_context *ctx_local;
  
  item_local = obj;
  if (((pdf_obj *)0x188 < obj) && (obj->kind == 'r')) {
    item_local = pdf_resolve_indirect_chain(ctx,obj);
  }
  if ((pdf_obj *)0x188 < item_local) {
    iVar2 = hd_push_try(ctx);
    if ((iVar2 != 0) && (iVar2 = __sigsetjmp(ctx->error->top->buffer,0), iVar2 == 0)) {
      pdf_array_push(ctx,item_local,item);
    }
    if (ctx->error->top->code < 3) {
      phVar1 = ctx->error->top;
      phVar1->code = phVar1->code + 1;
      pdf_drop_obj(ctx,item);
    }
    phVar1 = ctx->error->top;
    ctx->error->top = phVar1 + -1;
    if (1 < phVar1->code) {
      hd_rethrow(ctx);
    }
  }
  return;
}

Assistant:

void
pdf_array_push_drop(hd_context *ctx, pdf_obj *obj, pdf_obj *item)
{
    RESOLVE(obj);
    if (obj >= PDF_OBJ__LIMIT)
    {
        hd_try(ctx)
            pdf_array_push(ctx, obj, item);
        hd_always(ctx)
            pdf_drop_obj(ctx, item);
        hd_catch(ctx)
            hd_rethrow(ctx);
    }
}